

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afg2mps.cpp
# Opt level: O2

ssize_t __thiscall MPS::write(MPS *this,int __fd,void *__buf,size_t __n)

{
  undefined8 *puVar1;
  undefined4 extraout_var;
  runtime_error *this_00;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  bool bVar5;
  va_list v;
  void *local_1c8 [3];
  size_t local_1b0;
  char _error_msg_ [256];
  
  this->p = 0;
  this->cur_field = 0;
  builtin_strncpy(this->buf,
                  "                                                                                "
                  ,0x50);
  v[0].overflow_arg_area = &stack0x00000008;
  uVar2 = 0x10;
  local_1c8[2] = __buf;
  local_1b0 = __n;
  iVar4 = 0;
  if (0 < __fd) {
    iVar4 = __fd;
  }
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    uVar3 = (ulong)uVar2;
    if (uVar3 < 0x29) {
      uVar2 = uVar2 + 8;
      puVar1 = (undefined8 *)((long)local_1c8 + uVar3);
    }
    else {
      puVar1 = (undefined8 *)v[0].overflow_arg_area;
      v[0].overflow_arg_area = (void *)((long)v[0].overflow_arg_area + 8);
    }
    add_field(this,(char *)*puVar1);
  }
  if ((long)this->p < 0x50) {
    this->buf[this->p] = '\0';
    iVar4 = fprintf((FILE *)this->fout,"%s\n",this->buf);
    this->p = 0;
    this->cur_field = 0;
    builtin_strncpy(this->buf,
                    "                                                                                "
                    ,0x50);
    return CONCAT44(extraout_var,iVar4);
  }
  snprintf(_error_msg_,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d","p < BUF_LEN"
           ,
           "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/afg2mps.cpp"
           ,0x3b);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,_error_msg_);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void write(int count, ...) {
		clear();

		va_list v;
		va_start(v, count);
		for (int i = 0; i < count; i++) {
			add_field(va_arg(v, const char *));
		}
		va_end(v);

		throw_assert(p < BUF_LEN);
		buf[p] = 0;
		fprintf(fout, "%s\n", buf);
		clear();
	}